

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O0

void it_xm_convert_volume(int volume,IT_ENTRY *entry)

{
  int iVar1;
  IT_ENTRY *entry_local;
  int volume_local;
  
  entry->mask = entry->mask | 4;
  volume_local._0_1_ = (uchar)volume;
  entry->volpan = (uchar)volume_local;
  iVar1 = volume >> 4;
  if (3 < iVar1 - 1U) {
    if (iVar1 == 5) {
      if (volume == 0x50) {
        return;
      }
    }
    else if (iVar1 - 6U < 10) {
      return;
    }
    entry->mask = entry->mask & 0xfb;
  }
  return;
}

Assistant:

static void it_xm_convert_volume(int volume, IT_ENTRY *entry)
{
	entry->mask |= IT_ENTRY_VOLPAN;
	entry->volpan = volume;

	switch (volume >> 4) {
		case 0xA: /* set vibrato speed */
		case 0xB: /* vibrato */
		case 0xF: /* tone porta */
		case 0x6: /* vol slide up */
		case 0x7: /* vol slide down */
		case 0x8: /* fine vol slide up */
		case 0x9: /* fine vol slide down */
		case 0xC: /* set panning */
		case 0xD: /* pan slide left */
		case 0xE: /* pan slide right */
		case 0x1: /* set volume */
		case 0x2: /* set volume */
		case 0x3: /* set volume */
		case 0x4: /* set volume */
			break;

		case 0x5:
			if (volume == 0x50)
				break; /* set volume */
			/* else fall through */

		default:
			entry->mask &= ~IT_ENTRY_VOLPAN;
			break;
	}
}